

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_greedy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  int *ilimit_w;
  undefined8 *puVar1;
  uint uVar2;
  U32 UVar3;
  BYTE *pBVar4;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  BYTE *pBVar8;
  seqDef *psVar9;
  size_t sVar10;
  int iVar11;
  BYTE *pBVar12;
  U32 UVar13;
  ulong uVar14;
  long lVar15;
  BYTE *litEnd;
  int *ip;
  uint uVar16;
  BYTE *litEnd_1;
  U32 maxDistance;
  uint uVar17;
  uint local_a4;
  uint local_a0;
  BYTE *litLimit_w;
  int local_70;
  size_t ofbCandidate;
  BYTE *local_60;
  BYTE *local_58;
  BYTE *local_50;
  int *local_48;
  BYTE *local_40;
  U32 *local_38;
  
  pBVar4 = (ms->window).base;
  local_58 = (ms->window).dictBase;
  uVar2 = (ms->window).dictLimit;
  local_60 = pBVar4 + uVar2;
  local_50 = local_58 + uVar2;
  local_40 = local_58 + (ms->window).lowLimit;
  uVar17 = (ms->cParams).windowLog;
  uVar16 = (ms->cParams).minMatch;
  uVar6 = 6;
  if (uVar16 < 6) {
    uVar6 = uVar16;
  }
  uVar16 = 4;
  if (4 < uVar6) {
    uVar16 = uVar6;
  }
  local_a0 = *rep;
  local_a4 = rep[1];
  ms->lazySkipping = 0;
  uVar17 = 1 << ((byte)uVar17 & 0x1f);
  ip = (int *)((ulong)(local_60 == (BYTE *)src) + (long)src);
  iEnd = (BYTE *)(srcSize + (long)src);
  local_48 = (int *)((long)src + (srcSize - 8));
  ilimit_w = (int *)((long)src + (srcSize - 0x20));
  local_38 = rep;
LAB_01f6a671:
  do {
    if (local_48 <= ip) {
      *local_38 = local_a0;
      local_38[1] = local_a4;
      return (long)iEnd - (long)src;
    }
    local_70 = (int)pBVar4;
    iVar11 = ((int)ip - local_70) + 1;
    UVar3 = (ms->window).lowLimit;
    UVar13 = iVar11 - uVar17;
    if (iVar11 - UVar3 <= uVar17) {
      UVar13 = UVar3;
    }
    if (ms->loadedDictEnd != 0) {
      UVar13 = UVar3;
    }
    uVar6 = iVar11 - local_a0;
    if (((uVar2 - 1) - uVar6 < 3) || (iVar11 - UVar13 < local_a0)) {
LAB_01f6a6d8:
      ofbCandidate = 999999999;
      if (uVar16 == 6) {
        uVar7 = ZSTD_HcFindBestMatch_extDict_6(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else if (uVar16 == 5) {
        uVar7 = ZSTD_HcFindBestMatch_extDict_5(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else {
        uVar7 = ZSTD_HcFindBestMatch_extDict_4(ms,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      if (uVar7 < 4) {
        uVar7 = (long)ip - (long)src;
        ip = (int *)((long)ip + (uVar7 >> 8) + 1);
        ms->lazySkipping = (uint)(0x8ff < uVar7);
        goto LAB_01f6a671;
      }
      sVar10 = ofbCandidate;
      if (3 < ofbCandidate) {
        uVar14 = (long)ip + (-(long)pBVar4 - ofbCandidate) + 3;
        pBVar12 = local_60;
        pBVar8 = pBVar4;
        if ((uint)uVar14 < uVar2) {
          pBVar12 = local_40;
          pBVar8 = local_58;
        }
        pBVar8 = pBVar8 + (uVar14 & 0xffffffff);
        for (; ((src < ip && (pBVar12 < pBVar8)) && (*(BYTE *)((long)ip + -1) == pBVar8[-1]));
            ip = (int *)((long)ip + -1)) {
          pBVar8 = pBVar8 + -1;
          uVar7 = uVar7 + 1;
        }
        local_a4 = local_a0;
        local_a0 = (int)ofbCandidate - 3;
      }
    }
    else {
      pBVar8 = pBVar4;
      if (uVar6 < uVar2) {
        pBVar8 = local_58;
      }
      if (*(int *)((long)ip + 1) != *(int *)(pBVar8 + uVar6)) goto LAB_01f6a6d8;
      pBVar12 = iEnd;
      if (uVar6 < uVar2) {
        pBVar12 = local_50;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)((long)ip + 5),pBVar8 + (ulong)uVar6 + 4,iEnd,pBVar12,local_60);
      uVar7 = sVar10 + 4;
      ip = (int *)((long)ip + 1);
      sVar10 = 1;
    }
    uVar14 = (long)ip - (long)src;
    pBVar8 = seqStore->lit;
    if (ilimit_w < ip) {
      ZSTD_safecopyLiterals(pBVar8,(BYTE *)src,(BYTE *)ip,(BYTE *)ilimit_w);
LAB_01f6a835:
      seqStore->lit = seqStore->lit + uVar14;
      psVar9 = seqStore->sequences;
      if (0xffff < uVar14) {
        seqStore->longLengthType = ZSTD_llt_literalLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
    }
    else {
      uVar5 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar8 = *src;
      *(undefined8 *)(pBVar8 + 8) = uVar5;
      pBVar8 = seqStore->lit;
      if (0x10 < uVar14) {
        uVar5 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar8 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar8 + 0x18) = uVar5;
        if (0x20 < (long)uVar14) {
          lVar15 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar15 + 0x20);
            uVar5 = puVar1[1];
            pBVar12 = pBVar8 + lVar15 + 0x20;
            *(undefined8 *)pBVar12 = *puVar1;
            *(undefined8 *)(pBVar12 + 8) = uVar5;
            puVar1 = (undefined8 *)((long)src + lVar15 + 0x30);
            uVar5 = puVar1[1];
            *(undefined8 *)(pBVar12 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar12 + 0x18) = uVar5;
            lVar15 = lVar15 + 0x20;
          } while (pBVar12 + 0x20 < pBVar8 + uVar14);
        }
        goto LAB_01f6a835;
      }
      seqStore->lit = pBVar8 + uVar14;
      psVar9 = seqStore->sequences;
    }
    psVar9->litLength = (U16)uVar14;
    psVar9->offBase = (U32)sVar10;
    if (0xffff < uVar7 - 3) {
      seqStore->longLengthType = ZSTD_llt_matchLength;
      seqStore->longLengthPos = (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3);
    }
    psVar9->mlBase = (U16)(uVar7 - 3);
    seqStore->sequences = psVar9 + 1;
    if (ms->lazySkipping != 0) {
      ms->lazySkipping = 0;
    }
    uVar6 = local_a4;
    for (ip = (int *)((long)ip + uVar7); local_a4 = uVar6, src = ip, ip <= local_48;
        ip = (int *)((long)ip + sVar10 + 4)) {
      iVar11 = (int)ip - local_70;
      UVar3 = (ms->window).lowLimit;
      UVar13 = iVar11 - uVar17;
      if (iVar11 - UVar3 <= uVar17) {
        UVar13 = UVar3;
      }
      if (ms->loadedDictEnd != 0) {
        UVar13 = UVar3;
      }
      uVar6 = iVar11 - local_a4;
      pBVar8 = pBVar4;
      if (uVar6 < uVar2) {
        pBVar8 = local_58;
      }
      if ((((uVar2 - 1) - uVar6 < 3) || (iVar11 - UVar13 < local_a4)) ||
         (*ip != *(int *)(pBVar8 + uVar6))) break;
      pBVar12 = iEnd;
      if (uVar6 < uVar2) {
        pBVar12 = local_50;
      }
      sVar10 = ZSTD_count_2segments
                         ((BYTE *)(ip + 1),(BYTE *)((long)(pBVar8 + uVar6) + 4),iEnd,pBVar12,
                          local_60);
      pBVar8 = seqStore->lit;
      if (ilimit_w < ip) {
        ZSTD_safecopyLiterals(pBVar8,(BYTE *)ip,(BYTE *)ip,(BYTE *)ilimit_w);
      }
      else {
        uVar5 = *(undefined8 *)(ip + 2);
        *(undefined8 *)pBVar8 = *(undefined8 *)ip;
        *(undefined8 *)(pBVar8 + 8) = uVar5;
      }
      psVar9 = seqStore->sequences;
      psVar9->litLength = 0;
      psVar9->offBase = 1;
      if (0xffff < sVar10 + 1) {
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos = (U32)((ulong)((long)psVar9 - (long)seqStore->sequencesStart) >> 3)
        ;
      }
      psVar9->mlBase = (U16)(sVar10 + 1);
      seqStore->sequences = psVar9 + 1;
      uVar6 = local_a0;
      local_a0 = local_a4;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_greedy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 0);
}